

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense_layer.h
# Opt level: O3

void __thiscall yyml::nn::DenseLayer::~DenseLayer(DenseLayer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BackwardFunction<double> *pBVar2;
  pointer pcVar3;
  _Manager_type p_Var4;
  pointer ppAVar5;
  
  (this->super_LayerInterface)._vptr_LayerInterface = (_func_int **)&PTR_operator___0010ec18;
  pcVar3 = (this->name_)._M_dataplus._M_p;
  paVar1 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->bias_).name_._M_dataplus._M_p;
  paVar1 = &(this->bias_).name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  p_Var4 = (this->bias_).autograd_.backward_fn.super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    pBVar2 = &(this->bias_).autograd_.backward_fn;
    (*p_Var4)((_Any_data *)pBVar2,(_Any_data *)pBVar2,__destroy_functor);
  }
  ppAVar5 = (this->bias_).autograd_.next.
            super__Vector_base<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppAVar5 != (pointer)0x0) {
    operator_delete(ppAVar5,(long)(this->bias_).autograd_.next.
                                  super__Vector_base<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppAVar5
                   );
  }
  Tensor<double>::~Tensor(&(this->bias_).grads_);
  Tensor<double>::~Tensor(&(this->bias_).values_);
  pcVar3 = (this->weight_).name_._M_dataplus._M_p;
  paVar1 = &(this->weight_).name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  p_Var4 = (this->weight_).autograd_.backward_fn.super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    pBVar2 = &(this->weight_).autograd_.backward_fn;
    (*p_Var4)((_Any_data *)pBVar2,(_Any_data *)pBVar2,__destroy_functor);
  }
  ppAVar5 = (this->weight_).autograd_.next.
            super__Vector_base<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppAVar5 != (pointer)0x0) {
    operator_delete(ppAVar5,(long)(this->weight_).autograd_.next.
                                  super__Vector_base<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppAVar5
                   );
  }
  Tensor<double>::~Tensor(&(this->weight_).grads_);
  Tensor<double>::~Tensor(&(this->weight_).values_);
  return;
}

Assistant:

DenseLayer(TensorShape weight_shape, TensorShape bias_shape, std::string name)
      : weight_(weight_shape, name + "/weight"),
        bias_(bias_shape, name + "/bias"),
        name_(name) {}